

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffghtbll(fitsfile *fptr,int maxfield,LONGLONG *naxis1,LONGLONG *naxis2,int *tfields,char **ttype
            ,LONGLONG *tbcol,char **tform,char **tunit,char *extnm,int *status)

{
  int iVar1;
  ulong uVar2;
  uint nmax;
  LONGLONG llnaxis2;
  LONGLONG llnaxis1;
  int nfound;
  char value [71];
  char xtension [71];
  char comm [73];
  char name [75];
  uint local_208;
  undefined4 uStack_204;
  uint local_1fc;
  char **local_1f8;
  long local_1f0;
  LONGLONG local_1e8;
  LONGLONG local_1e0;
  uint local_1d8 [24];
  char local_178 [80];
  int local_128;
  short local_124;
  char local_d8 [80];
  long local_88;
  char local_80;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_1fc = maxfield;
    local_1f8 = ttype;
    ffgkyn(fptr,1,(char *)&local_88,local_178,local_d8,status);
    if (local_80 == '\0' && local_88 == 0x4e4f49534e455458) {
      iVar1 = ffc2s(local_178,(char *)&local_128,status);
      if (iVar1 < 1) {
        if ((local_178[0] != '\'') || (local_124 != 0x45 || local_128 != 0x4c424154)) {
          snprintf((char *)local_1d8,0x51,"This is not a TABLE extension: %s",local_178);
          ffpmsg((char *)local_1d8);
          *status = 0xe2;
          return 0xe2;
        }
        iVar1 = ffgttb(fptr,&local_1e0,&local_1e8,&local_1f0,(long *)&local_208,status);
        if (iVar1 < 1) {
          if (naxis1 != (LONGLONG *)0x0) {
            *naxis1 = local_1e0;
          }
          if (naxis2 != (LONGLONG *)0x0) {
            *naxis2 = local_1e8;
          }
          if (local_1f0 != 0) {
            snprintf((char *)local_1d8,0x51,"PCOUNT = %.0f is illegal in ASCII table; must = 0",
                     (double)local_1f0);
            ffpmsg((char *)local_1d8);
            *status = 0xd6;
            return 0xd6;
          }
          if (tfields != (int *)0x0) {
            *tfields = local_208;
          }
          nmax = local_208;
          if (-1 < (int)local_1fc) {
            uVar2 = (ulong)local_1fc;
            if ((long)CONCAT44(uStack_204,local_208) < (long)(ulong)local_1fc) {
              uVar2 = CONCAT44(uStack_204,local_208);
            }
            nmax = (uint)uVar2;
          }
          if (0 < (int)nmax) {
            uVar2 = 0;
            do {
              if (local_1f8 != (char **)0x0) {
                *local_1f8[uVar2] = '\0';
              }
              if (tunit != (char **)0x0) {
                *tunit[uVar2] = '\0';
              }
              uVar2 = uVar2 + 1;
            } while ((nmax & 0x7fffffff) != uVar2);
            if (local_1f8 != (char **)0x0) {
              ffgkns(fptr,"TTYPE",1,nmax,local_1f8,(int *)local_1d8,status);
            }
            if (tunit != (char **)0x0) {
              ffgkns(fptr,"TUNIT",1,nmax,tunit,(int *)local_1d8,status);
            }
            if (0 < *status) {
              return *status;
            }
            if ((tbcol != (LONGLONG *)0x0) &&
               ((ffgknjj(fptr,"TBCOL",1,nmax,tbcol,(int *)local_1d8,status), 0 < *status ||
                (local_1d8[0] != nmax)))) {
              ffpmsg("Required TBCOL keyword(s) not found in ASCII table header (ffghtbll).");
              *status = 0xe7;
              return 0xe7;
            }
            if ((tform != (char **)0x0) &&
               ((ffgkns(fptr,"TFORM",1,nmax,tform,(int *)local_1d8,status), 0 < *status ||
                (local_1d8[0] != nmax)))) {
              ffpmsg("Required TFORM keyword(s) not found in ASCII table header (ffghtbll).");
              *status = 0xe8;
              return 0xe8;
            }
          }
          if (extnm == (char *)0x0) {
            return *status;
          }
          *extnm = '\0';
          iVar1 = *status;
          ffgkys(fptr,"EXTNAME",extnm,local_d8,status);
          if (*status != 0xca) {
            return *status;
          }
          *status = iVar1;
          return iVar1;
        }
      }
      else {
        ffpmsg("Bad value string for XTENSION keyword:");
        ffpmsg(local_178);
      }
      iVar1 = *status;
    }
    else {
      snprintf((char *)local_1d8,0x51,"First keyword of the extension is not XTENSION: %s",&local_88
              );
      ffpmsg((char *)local_1d8);
      *status = 0xe1;
      iVar1 = 0xe1;
    }
  }
  return iVar1;
}

Assistant:

int ffghtbll(fitsfile *fptr, /* I - FITS file pointer                        */
           int maxfield,    /* I - maximum no. of columns to read;          */
           LONGLONG *naxis1, /* O - length of table row in bytes             */
           LONGLONG *naxis2, /* O - number of rows in the table              */
           int *tfields,    /* O - number of columns in the table           */
           char **ttype,    /* O - name of each column                      */
           LONGLONG *tbcol, /* O - byte offset in row to each column        */
           char **tform,    /* O - value of TFORMn keyword for each column  */
           char **tunit,    /* O - value of TUNITn keyword for each column  */
           char *extnm,     /* O - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the ASCII TaBle:
  Check that the keywords conform to the FITS standard and return the
  parameters which describe the table.
*/
{
    int ii, maxf, nfound, tstatus;
    long fields;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE], message[FLEN_ERRMSG];
    LONGLONG llnaxis1, llnaxis2, pcount;

    if (*status > 0)
        return(*status);

    /* read the first keyword of the extension */
    ffgkyn(fptr, 1, name, value, comm, status);

    if (!strcmp(name, "XTENSION"))
    {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                 ( strcmp(xtension, "TABLE") ) )
            {
                snprintf(message, FLEN_ERRMSG,
                "This is not a TABLE extension: %s", value);
                ffpmsg(message);
                return(*status = NOT_ATABLE);
            }
    }

    else  /* error: 1st keyword of extension != XTENSION */
    {
        snprintf(message, FLEN_ERRMSG,
        "First keyword of the extension is not XTENSION: %s", name);
        ffpmsg(message);
        return(*status = NO_XTENSION);
    }

    if (ffgttb(fptr, &llnaxis1, &llnaxis2, &pcount, &fields, status) > 0)
        return(*status);

    if (naxis1)
       *naxis1 = llnaxis1;

    if (naxis2)
       *naxis2 = llnaxis2;

    if (pcount != 0)
    {
       snprintf(message, FLEN_ERRMSG, "PCOUNT = %.0f is illegal in ASCII table; must = 0",
             (double) pcount);
       ffpmsg(message);
       return(*status = BAD_PCOUNT);
    }

    if (tfields)
       *tfields = fields;

    if (maxfield < 0)
        maxf = fields;
    else
        maxf = minvalue(maxfield, fields);

    if (maxf > 0)
    {
        for (ii = 0; ii < maxf; ii++)
        {   /* initialize optional keyword values */
            if (ttype)
                *ttype[ii] = '\0';   

            if (tunit)
                *tunit[ii] = '\0';
        }

   
        if (ttype)
            ffgkns(fptr, "TTYPE", 1, maxf, ttype, &nfound, status);

        if (tunit)
            ffgkns(fptr, "TUNIT", 1, maxf, tunit, &nfound, status);

        if (*status > 0)
            return(*status);

        if (tbcol)
        {
            ffgknjj(fptr, "TBCOL", 1, maxf, tbcol, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TBCOL keyword(s) not found in ASCII table header (ffghtbll).");
                return(*status = NO_TBCOL);
            }
        }

        if (tform)
        {
            ffgkns(fptr, "TFORM", 1, maxf, tform, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TFORM keyword(s) not found in ASCII table header (ffghtbll).");
                return(*status = NO_TFORM);
            }
        }
    }

    if (extnm)
    {
        extnm[0] = '\0';

        tstatus = *status;
        ffgkys(fptr, "EXTNAME", extnm, comm, status);

        if (*status == KEY_NO_EXIST)
            *status = tstatus;  /* keyword not required, so ignore error */
    }

    return(*status);
}